

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.cc
# Opt level: O1

void onmt::unicode::explode_utf8_with_marks
               (string *str,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *chars,vector<int,_std::allocator<int>_> *code_points_main,
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *code_points_combining,vector<int,_std::allocator<int>_> *protected_chars)

{
  pointer *ppvVar1;
  char *pcVar2;
  iterator iVar3;
  pointer pvVar4;
  iterator __position;
  code_point_t u;
  CharType CVar5;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var6;
  char *str_00;
  size_t char_size;
  int local_4c;
  size_t local_48;
  size_t local_40;
  char *local_38;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(chars,str->_M_string_length);
  if (code_points_main != (vector<int,_std::allocator<int>_> *)0x0) {
    std::vector<int,_std::allocator<int>_>::reserve(code_points_main,str->_M_string_length);
  }
  if (code_points_combining !=
      (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       *)0x0) {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::reserve(code_points_combining,str->_M_string_length);
  }
  str_00 = (str->_M_dataplus)._M_p;
  if (*str_00 != '\0') {
    do {
      local_48 = 0;
      u = utf8_to_cp(str_00,&local_48);
      if (u == 0) {
        local_48 = 1;
      }
      else {
        local_40 = local_48;
        local_4c = u;
        local_38 = str_00;
        if ((((chars->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start ==
              (chars->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) ||
            (CVar5 = get_char_type(u), CVar5 != Mark)) ||
           ((protected_chars != (vector<int,_std::allocator<int>_> *)0x0 &&
            (_Var6 = std::
                     __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                               ((protected_chars->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start,
                                (protected_chars->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_finish,
                                (code_points_main->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_finish + -1),
            _Var6._M_current !=
            (protected_chars->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish)))) {
          if (code_points_main != (vector<int,_std::allocator<int>_> *)0x0) {
            iVar3._M_current =
                 (code_points_main->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (code_points_main->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int&>
                        ((vector<int,std::allocator<int>> *)code_points_main,iVar3,&local_4c);
            }
            else {
              *iVar3._M_current = local_4c;
              (code_points_main->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar3._M_current + 1;
            }
          }
          if (code_points_combining !=
              (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)0x0) {
            __position._M_current =
                 (code_points_combining->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (code_points_combining->
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::_M_realloc_insert<>(code_points_combining,__position);
            }
            else {
              ((__position._M_current)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              ((__position._M_current)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              ((__position._M_current)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              ppvVar1 = &(code_points_combining->
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppvVar1 = *ppvVar1 + 1;
            }
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*&,unsigned_long&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)chars,
                     &local_38,&local_40);
        }
        else {
          if (code_points_combining !=
              (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)0x0) {
            pvVar4 = (code_points_combining->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            iVar3._M_current =
                 pvVar4[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                pvVar4[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)(pvVar4 + -1),iVar3,&local_4c);
            }
            else {
              *iVar3._M_current = local_4c;
              pvVar4[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar3._M_current + 1;
            }
          }
          std::__cxx11::string::append
                    ((char *)((chars->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish + -1),(ulong)local_38);
        }
      }
      pcVar2 = str_00 + local_48;
      str_00 = str_00 + local_48;
    } while (*pcVar2 != '\0');
  }
  return;
}

Assistant:

void explode_utf8_with_marks(const std::string& str,
                                 std::vector<std::string>& chars,
                                 std::vector<code_point_t>* code_points_main,
                                 std::vector<std::vector<code_point_t>>* code_points_combining,
                                 const std::vector<code_point_t>* protected_chars)
    {
      chars.reserve(str.length());
      if (code_points_main)
        code_points_main->reserve(str.length());
      if (code_points_combining)
        code_points_combining->reserve(str.length());

      const auto callback = [&](const char* data,
                                size_t length,
                                code_point_t code_point) {
        if (chars.empty()
            || !is_mark(code_point)
            || (protected_chars
                && std::find(protected_chars->begin(),
                             protected_chars->end(),
                             code_points_main->back()) != protected_chars->end()))
        {
          if (code_points_main)
            code_points_main->emplace_back(code_point);
          if (code_points_combining)
            code_points_combining->emplace_back();
          chars.emplace_back(data, length);
        }
        else
        {
          if (code_points_combining)
            code_points_combining->back().push_back(code_point);
          chars.back().append(data, length);
        }
      };

      character_iterator(str, callback);
    }